

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleRowDown2Box_16_C(uint16_t *src_ptr,ptrdiff_t src_stride,uint16_t *dst,int dst_width)

{
  ushort *puVar1;
  long lVar2;
  uint16_t *s;
  
  for (lVar2 = 0; (int)lVar2 < dst_width + -1; lVar2 = lVar2 + 2) {
    dst[lVar2] = (uint16_t)
                 ((uint)src_ptr[src_stride + lVar2 * 2] +
                  (uint)src_ptr[lVar2 * 2 + 1] + (uint)src_ptr[lVar2 * 2] +
                  (uint)src_ptr[src_stride + lVar2 * 2 + 1] + 2 >> 2);
    dst[lVar2 + 1] =
         (uint16_t)
         ((uint)src_ptr[src_stride + lVar2 * 2 + 2] +
          (uint)src_ptr[lVar2 * 2 + 3] + (uint)src_ptr[lVar2 * 2 + 2] +
          (uint)src_ptr[src_stride + lVar2 * 2 + 3] + 2 >> 2);
  }
  if ((dst_width & 1U) != 0) {
    puVar1 = src_ptr + lVar2 * 2;
    dst[lVar2] = (uint16_t)
                 ((uint)puVar1[src_stride + 1] +
                  (uint)src_ptr[src_stride + lVar2 * 2] + (uint)puVar1[1] + (uint)*puVar1 + 2 >> 2);
  }
  return;
}

Assistant:

void ScaleRowDown2Box_16_C(const uint16_t* src_ptr,
                           ptrdiff_t src_stride,
                           uint16_t* dst,
                           int dst_width) {
  const uint16_t* s = src_ptr;
  const uint16_t* t = src_ptr + src_stride;
  int x;
  for (x = 0; x < dst_width - 1; x += 2) {
    dst[0] = (s[0] + s[1] + t[0] + t[1] + 2) >> 2;
    dst[1] = (s[2] + s[3] + t[2] + t[3] + 2) >> 2;
    dst += 2;
    s += 4;
    t += 4;
  }
  if (dst_width & 1) {
    dst[0] = (s[0] + s[1] + t[0] + t[1] + 2) >> 2;
  }
}